

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xc-info.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  ushort **ppuVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double omega;
  double beta;
  double alpha;
  xc_func_type func;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  xc_func_type local_1d0;
  
  if (argc != 2) {
    printf("Usage: %s [ func_id | func_name ]\n",*argv);
    return 1;
  }
  pcVar3 = xc_version_string();
  printf("libxc version %s\n",pcVar3);
  pcVar3 = xc_reference();
  puts(pcVar3);
  pcVar3 = xc_reference_doi();
  printf("doi: %s\n",pcVar3);
  putchar(10);
  ppuVar4 = __ctype_b_loc();
  pcVar3 = argv[1];
  if ((*(byte *)((long)*ppuVar4 + (long)*pcVar3 * 2 + 1) & 4) == 0) {
    uVar1 = atoi(pcVar3);
  }
  else {
    uVar1 = xc_functional_get_number(pcVar3);
  }
  iVar2 = xc_func_init(&local_1d0,uVar1,1);
  if (iVar2 != 0) {
    printf("Functional \'%s\' not found.\n",argv[1]);
    return 1;
  }
  pcVar3 = xc_functional_get_name(uVar1);
  printf("%10s: %-20i\n%10s: %-25s\n","func_id",(ulong)uVar1,"name",pcVar3);
  pcVar5 = get_family(&local_1d0);
  pcVar6 = get_kind(&local_1d0);
  printf("%10s: %-20s\n%10s: %-25s\n","family",pcVar5,"kind",pcVar6);
  printf("%10s: %s\n","comment",(local_1d0.info)->name);
  iVar2 = (local_1d0.info)->family;
  if (((iVar2 == 0x20) || (iVar2 == 0x80)) || (iVar2 == 0x40)) {
    uVar1 = (local_1d0.info)->flags;
    if ((uVar1 >> 0xc & 1) == 0 &&
        (uVar1 >> 9 & 1) + (uVar1 >> 8 & 1) + (uint)((uVar1 >> 0xb & 1) != 0) == 0) {
      dVar9 = xc_hyb_exx_coef(&local_1d0);
      printf("\nThis is a global hybrid functional with %4.1f%% of exact exchange.\n",dVar9 * 100.0)
      ;
      goto LAB_0015676e;
    }
    xc_hyb_cam_coef(&local_1d0,&local_1e8,&local_1d8,&local_1e0);
    printf("\nThis is a range-separated hybrid functional with range-separation constant % .3f,\n",
           local_1e8);
    printf("and %4.1f%% short-range and %4.1f%% long-range exact exchange,\n",
           (local_1e0 + local_1d8) * 100.0,local_1d8 * 100.0);
    if (((local_1d0.info)->flags & 0x900U) == 0) {
      if (((local_1d0.info)->flags & 0x1200U) == 0) goto LAB_0015676e;
      pcVar5 = "using the Yukawa kernel.";
    }
    else {
      pcVar5 = "using the error function kernel.";
    }
  }
  else {
    if (((local_1d0.info)->kind & 0xfffffffdU) != 0) goto LAB_0015676e;
    pcVar5 = "\nThis is a pure functional with no exact exchange.";
  }
  puts(pcVar5);
LAB_0015676e:
  puts("\nReference(s):");
  lVar7 = 3;
  do {
    if ((local_1d0.info)->refs[lVar7 + -3] == (func_reference_type *)0x0) break;
    printf("  *) %s\n",(local_1d0.info)->refs[lVar7 + -3]->ref);
    if (*(local_1d0.info)->refs[lVar7 + -3]->doi != '\0') {
      printf("     doi: %s\n");
    }
    printf("     bibtex key: %s\n",(local_1d0.info)->refs[lVar7 + -3]->key);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 8);
  puts("\nImplementation has support for:");
  if (((local_1d0.info)->flags & 1) != 0) {
    puts("  *) energy");
  }
  if (((local_1d0.info)->flags & 2) != 0) {
    puts("  *) first derivative");
  }
  if (((local_1d0.info)->flags & 4) != 0) {
    puts("  *) second derivative");
  }
  if (((local_1d0.info)->flags & 8) != 0) {
    puts("  *) third derivative");
  }
  if (((local_1d0.info)->flags & 8) != 0) {
    puts("  *) fourth derivative");
  }
  puts("\nDefault thresholds:");
  printf("density: %e\n",local_1d0.dens_threshold);
  printf("   zeta: %e\n",local_1d0.zeta_threshold);
  uVar1 = (local_1d0.info)->family - 2;
  if ((uVar1 < 0x3f) && ((0x4000000040000005U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
    printf("  sigma: %e\n",local_1d0.sigma_threshold);
  }
  if (((local_1d0.info)->family == 0x40) || ((local_1d0.info)->family == 4)) {
    printf("    tau: %e\n",local_1d0.tau_threshold);
  }
  uVar1 = xc_func_info_get_n_ext_params(local_1d0.info);
  if ((int)uVar1 < 1) {
    puts("\nFunctional has no external parameters.");
  }
  else {
    uVar8 = 0;
    printf("\nFunctional has %i external parameters:\n",(ulong)uVar1);
    printf("%3s %13s %8s %s\n","idx","value","name","description");
    do {
      iVar2 = (int)uVar8;
      dVar9 = xc_func_info_get_ext_params_default_value(local_1d0.info,iVar2);
      pcVar5 = xc_func_info_get_ext_params_name(local_1d0.info,iVar2);
      pcVar6 = xc_func_info_get_ext_params_description(local_1d0.info,iVar2);
      printf("%3i % e %8s %s\n",dVar9,uVar8,pcVar5,pcVar6);
      uVar8 = (ulong)(iVar2 + 1U);
    } while (uVar1 != iVar2 + 1U);
  }
  xc_func_end(&local_1d0);
  libxc_free(pcVar3);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  int i, func_id, error, npar;
  xc_func_type func;
  char *fname;

  if(argc!=2) {
    printf("Usage: %s [ func_id | func_name ]\n",argv[0]);
    return 1;
  }

  /* Print libxc information */
  printf("libxc version %s\n",xc_version_string());
  printf("%s\n", xc_reference());
  printf("doi: %s\n", xc_reference_doi());
  printf("\n");

  /* Is functional defined by a string constant? */
  if(isalpha(argv[1][0]))
    func_id = xc_functional_get_number(argv[1]);
  else
    func_id = atoi(argv[1]);

  /* Initialize functional */
  error = xc_func_init(&func, func_id, XC_UNPOLARIZED);
  if(error) {
    printf("Functional '%s' not found.\n", argv[1]);
    return 1;
  }

  /* Get functional name */
  fname = xc_functional_get_name(func_id);

  /* Print out info */
  printf("%10s: %-20i\n%10s: %-25s\n", "func_id", func_id, "name", fname);
  printf("%10s: %-20s\n%10s: %-25s\n", "family", get_family(&func), "kind", get_kind(&func));
  printf("%10s: %s\n", "comment", func.info->name);

  /* Print out hybrid exchange info */
  if(func.info->family==XC_FAMILY_HYB_LDA || func.info->family==XC_FAMILY_HYB_GGA || func.info->family==XC_FAMILY_HYB_MGGA) {
    /* Range separation? */
    int rangesep=0;
    if(func.info->flags & XC_FLAGS_HYB_CAM)
      rangesep++;
    if(func.info->flags & XC_FLAGS_HYB_CAMY)
      rangesep++;
    if(func.info->flags & XC_FLAGS_HYB_LC)
      rangesep++;
    if(func.info->flags & XC_FLAGS_HYB_LCY)
      rangesep++;

    if(rangesep) {
      double alpha, beta, omega;
      xc_hyb_cam_coef(&func,&omega,&alpha,&beta);
      printf("\nThis is a range-separated hybrid functional with range-separation constant % .3f,\n",omega);
      printf("and %4.1f%% short-range and %4.1f%% long-range exact exchange,\n",(alpha+beta)*100,(alpha)*100);

      if(func.info->flags & XC_FLAGS_HYB_CAM || func.info->flags & XC_FLAGS_HYB_LC)
        printf("using the error function kernel.\n");
      else if(func.info->flags & XC_FLAGS_HYB_CAMY || func.info->flags & XC_FLAGS_HYB_LCY)
        printf("using the Yukawa kernel.\n");
    } else {
      double alpha=xc_hyb_exx_coef(&func);
      printf("\nThis is a global hybrid functional with %4.1f%% of exact exchange.\n",alpha*100);
    }
  } else {
    if(func.info->kind == XC_EXCHANGE || func.info->kind == XC_EXCHANGE_CORRELATION)
      printf("\nThis is a pure functional with no exact exchange.\n");
  }

  printf("\nReference(s):\n");
  for(i = 0; i < 5; i++){
    if(func.info->refs[i] == NULL) break;
    printf("  *) %s\n", func.info->refs[i]->ref);
    if(strlen(func.info->refs[i]->doi) > 0){
       printf("     doi: %s\n", func.info->refs[i]->doi);
    }
    printf("     bibtex key: %s\n", func.info->refs[i]->key);
  }

  printf("\nImplementation has support for:\n");
  if(func.info->flags & XC_FLAGS_HAVE_EXC)
    printf("  *) energy\n");
  if(func.info->flags & XC_FLAGS_HAVE_VXC)
    printf("  *) first derivative\n");
  if(func.info->flags & XC_FLAGS_HAVE_FXC)
    printf("  *) second derivative\n");
  if(func.info->flags & XC_FLAGS_HAVE_KXC)
    printf("  *) third derivative\n");
  if(func.info->flags & XC_FLAGS_HAVE_KXC)
    printf("  *) fourth derivative\n");

  printf("\nDefault thresholds:\n");
  printf("density: %e\n",func.dens_threshold);
  printf("   zeta: %e\n",func.zeta_threshold);
  if(is_gga(func.info->family))
    printf("  sigma: %e\n",func.sigma_threshold);
  if(is_mgga(func.info->family))
    printf("    tau: %e\n",func.tau_threshold);
  
  /* Query parameters */
  npar = xc_func_info_get_n_ext_params(func.info);
  if(npar > 0) {
    printf("\nFunctional has %i external parameters:\n",npar);
    printf("%3s %13s %8s %s\n","idx","value","name","description");
    for(i = 0; i < npar; i++)
      printf("%3i % e %8s %s\n", i,
             xc_func_info_get_ext_params_default_value(func.info, i),
             xc_func_info_get_ext_params_name(func.info, i),
             xc_func_info_get_ext_params_description(func.info, i));
  } else {
    printf("\nFunctional has no external parameters.\n");
  }

  /* Free memory */
  xc_func_end(&func);
  libxc_free(fname);

  return 0;
}